

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialnonce.cpp
# Opt level: O0

void __thiscall
ConfidentialNonce_Constractor_sizeerr_Test::TestBody
          (ConfidentialNonce_Constractor_sizeerr_Test *this)

{
  bool bVar1;
  AssertHelper local_98;
  Message local_90 [2];
  CfdException *anon_var_0;
  string local_78;
  undefined1 local_58 [8];
  ConfidentialNonce nonce;
  char *pcStack_18;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ConfidentialNonce_Constractor_sizeerr_Test *this_local;
  
  gtest_msg.value = (char *)this;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffe8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffe8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_78,"001122",(allocator *)((long)&anon_var_0 + 7));
      cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_58,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)local_58);
    }
    pcStack_18 = 
    "Expected: ConfidentialNonce nonce(\"001122\") throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_90);
  testing::internal::AssertHelper::AssertHelper
            (&local_98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialnonce.cpp"
             ,0x44,pcStack_18);
  testing::internal::AssertHelper::operator=(&local_98,local_90);
  testing::internal::AssertHelper::~AssertHelper(&local_98);
  testing::Message::~Message(local_90);
  return;
}

Assistant:

TEST(ConfidentialNonce, Constractor_sizeerr) {
  // error
  EXPECT_THROW(ConfidentialNonce nonce("001122"), CfdException);
}